

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

char * SoapySDRDevice_getAntenna(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined1 *puVar1;
  char *pcVar2;
  string sStack_38;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0xe8))(&sStack_38,device,direction,channel);
  pcVar2 = toCString(&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return pcVar2;
}

Assistant:

char *SoapySDRDevice_getAntenna(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->getAntenna(direction, channel));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}